

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

void __thiscall CVmObjTads::notify_delete(CVmObjTads *this,int in_root_set)

{
  CVmVarHeap *pCVar1;
  undefined4 in_ESI;
  CVmObjTads *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_RDI->super_CVmObject).ext_ != (char *)0x0) {
    get_hdr(in_RDI);
    vm_tadsobj_hdr::free_mem((vm_tadsobj_hdr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    pCVar1 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar1->_vptr_CVmVarHeap[6])(pCVar1,(in_RDI->super_CVmObject).ext_);
  }
  return;
}

Assistant:

void CVmObjTads::notify_delete(VMG_ int in_root_set)
{
    /* free our extension */
    if (ext_ != 0)
    {
        /* tell the header to delete its memory */
        get_hdr()->free_mem();

        /* delete the extension */
        G_mem->get_var_heap()->free_mem(ext_);
    }
}